

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_32sto14u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  OPJ_INT32 OVar4;
  ulong uVar5;
  undefined1 *puVar6;
  uint local_44;
  uint local_40;
  OPJ_UINT32 src2_1;
  OPJ_UINT32 src1_1;
  OPJ_UINT32 src0_1;
  OPJ_UINT32 src3;
  OPJ_UINT32 src2;
  OPJ_UINT32 src1;
  OPJ_UINT32 src0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_BYTE *pDst_local;
  OPJ_INT32 *pSrc_local;
  
  length_local = (OPJ_SIZE_T)pDst;
  for (_src1 = 0; _src1 < (length & 0xfffffffffffffffc); _src1 = _src1 + 4) {
    uVar1 = pSrc[_src1];
    uVar2 = pSrc[_src1 + 1];
    uVar3 = pSrc[_src1 + 2];
    OVar4 = pSrc[_src1 + 3];
    *(char *)length_local = (char)(uVar1 >> 6);
    *(byte *)(length_local + 1) = (byte)((uVar1 & 0x3f) << 2) | (byte)(uVar2 >> 0xc);
    *(char *)(length_local + 2) = (char)(uVar2 >> 4);
    *(byte *)(length_local + 3) = (byte)((uVar2 & 0xf) << 4) | (byte)(uVar3 >> 10);
    *(char *)(length_local + 4) = (char)(uVar3 >> 2);
    puVar6 = (undefined1 *)(length_local + 6);
    *(byte *)(length_local + 5) = (byte)((uVar3 & 3) << 6) | (byte)((uint)OVar4 >> 8);
    length_local = length_local + 7;
    *puVar6 = (char)OVar4;
  }
  if ((length & 3) != 0) {
    uVar1 = pSrc[_src1];
    local_40 = 0;
    local_44 = 0;
    uVar5 = length & 3;
    if ((1 < uVar5) && (local_40 = pSrc[_src1 + 1], 2 < uVar5)) {
      local_44 = pSrc[_src1 + 2];
    }
    *(char *)length_local = (char)(uVar1 >> 6);
    *(byte *)(length_local + 1) = (byte)((uVar1 & 0x3f) << 2) | (byte)(local_40 >> 0xc);
    if (1 < uVar5) {
      *(char *)(length_local + 2) = (char)(local_40 >> 4);
      *(byte *)(length_local + 3) = (byte)((local_40 & 0xf) << 4) | (byte)(local_44 >> 10);
      if (2 < uVar5) {
        *(char *)(length_local + 4) = (char)(local_44 >> 2);
        *(char *)(length_local + 5) = (char)((local_44 & 3) << 6);
      }
    }
  }
  return;
}

Assistant:

static void tif_32sto14u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i += 4U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];

        *pDst++ = (OPJ_BYTE)(src0 >> 6);
        *pDst++ = (OPJ_BYTE)(((src0 & 0x3FU) << 2) | (src1 >> 12));
        *pDst++ = (OPJ_BYTE)(src1 >> 4);
        *pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 10));
        *pDst++ = (OPJ_BYTE)(src2 >> 2);
        *pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6) | (src3 >> 8));
        *pDst++ = (OPJ_BYTE)(src3);
    }

    if (length & 3U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = 0U;
        OPJ_UINT32 src2 = 0U;
        length = length & 3U;

        if (length > 1U) {
            src1 = (OPJ_UINT32)pSrc[i + 1];
            if (length > 2U) {
                src2 = (OPJ_UINT32)pSrc[i + 2];
            }
        }
        *pDst++ = (OPJ_BYTE)(src0 >> 6);
        *pDst++ = (OPJ_BYTE)(((src0 & 0x3FU) << 2) | (src1 >> 12));
        if (length > 1U) {
            *pDst++ = (OPJ_BYTE)(src1 >> 4);
            *pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 10));
            if (length > 2U) {
                *pDst++ = (OPJ_BYTE)(src2 >> 2);
                *pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6));
            }
        }
    }
}